

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

bool __thiscall
QMakeEvaluator::getMemberArgs
          (QMakeEvaluator *this,ProKey *func,int srclen,ProStringList *args,int *start,int *end)

{
  bool bVar1;
  int iVar2;
  storage_type *psVar3;
  int iVar4;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QArrayDataPointer<char16_t> local_88;
  ProString local_70;
  bool ok;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *start = 0;
  *end = 0;
  if ((ulong)(args->super_QList<ProString>).d.size < 2) {
LAB_001e4a80:
    iVar2 = *start;
    if (iVar2 < 0) {
      iVar2 = iVar2 + srclen;
      *start = iVar2;
    }
    iVar4 = *end;
    if (iVar4 < 0) {
      iVar4 = iVar4 + srclen;
      *end = iVar4;
      iVar2 = *start;
    }
    if (iVar2 < srclen && -1 < iVar2) {
      bVar1 = iVar4 < srclen && -1 < iVar4;
      goto LAB_001e4b40;
    }
  }
  else {
    ok = true;
    this_00 = (args->super_QList<ProString>).d.ptr + 1;
    iVar2 = ProString::toInt(this_00,&ok,10);
    *start = iVar2;
    if (ok == false) {
      if ((args->super_QList<ProString>).d.size == 2) {
        iVar2 = ProString::indexOf(this_00,(QString *)(QMakeInternal::statics + 0xf0),0,
                                   CaseSensitive);
        if (iVar2 != -1) {
          ProString::left(&local_70,this_00,iVar2);
          iVar4 = ProString::toInt(&local_70,&ok,10);
          *start = iVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
          if (ok == true) {
            ProString::mid(&local_70,this_00,iVar2 + 2,-1);
            iVar2 = ProString::toInt(&local_70,&ok,10);
            *end = iVar2;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_70);
          }
        }
      }
      if (ok != false) goto LAB_001e4a80;
      ProString::toQString(&func->super_ProString,&this->m_tmp1);
      ProString::toQString(this_00,&this->m_tmp2);
      psVar3 = (storage_type *)
               QByteArrayView::lengthHelperCharArray("%1() argument 2 (start) \'%2\' invalid.",0x26)
      ;
      QVar6.m_data = psVar3;
      QVar6.m_size = (qsizetype)&local_88;
      QString::fromLatin1(QVar6);
      QString::arg<QString&,QString&>
                (&local_70.m_string,(QString *)&local_88,&this->m_tmp1,&this->m_tmp2);
    }
    else {
      *end = iVar2;
      if ((args->super_QList<ProString>).d.size == 3) {
        iVar2 = ProString::toInt((args->super_QList<ProString>).d.ptr + 2,&ok,10);
        *end = iVar2;
      }
      if ((ok & 1U) != 0) goto LAB_001e4a80;
      ProString::toQString(&func->super_ProString,&this->m_tmp1);
      ProString::toQString((args->super_QList<ProString>).d.ptr + 2,&this->m_tmp2);
      psVar3 = (storage_type *)
               QByteArrayView::lengthHelperCharArray("%1() argument 3 (end) \'%2\' invalid.",0x24);
      QVar5.m_data = psVar3;
      QVar5.m_size = (qsizetype)&local_88;
      QString::fromLatin1(QVar5);
      QString::arg<QString&,QString&>
                (&local_70.m_string,(QString *)&local_88,&this->m_tmp1,&this->m_tmp2);
    }
    evalError(this,&local_70.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  bVar1 = false;
LAB_001e4b40:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool
QMakeEvaluator::getMemberArgs(const ProKey &func, int srclen, const ProStringList &args,
                              int *start, int *end)
{
    *start = 0, *end = 0;
    if (args.size() >= 2) {
        bool ok = true;
        const ProString &start_str = args.at(1);
        *start = start_str.toInt(&ok);
        if (!ok) {
            if (args.size() == 2) {
                int dotdot = start_str.indexOf(statics.strDotDot);
                if (dotdot != -1) {
                    *start = start_str.left(dotdot).toInt(&ok);
                    if (ok)
                        *end = start_str.mid(dotdot+2).toInt(&ok);
                }
            }
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(start_str, m_tmp2);
                evalError(fL1S("%1() argument 2 (start) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        } else {
            *end = *start;
            if (args.size() == 3)
                *end = args.at(2).toInt(&ok);
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(args.at(2), m_tmp2);
                evalError(fL1S("%1() argument 3 (end) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        }
    }
    if (*start < 0)
        *start += srclen;
    if (*end < 0)
        *end += srclen;
    if (*start < 0 || *start >= srclen || *end < 0 || *end >= srclen)
        return false;
    return true;
}